

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall
ON_Mesh::GetCurvatureStats(ON_Mesh *this,curvature_style kappa_style,ON_MeshCurvatureStats *stats)

{
  int iVar1;
  double dVar2;
  ON_MeshCurvatureStats *pOVar3;
  long lVar4;
  ON_3fVector *in_R8;
  bool bVar5;
  
  stats->m_style = unknown_curvature_style;
  stats->m_infinity = 0.0;
  stats->m_count_infinite = 0;
  stats->m_count = 0;
  stats->m_mode = 0.0;
  stats->m_average = 0.0;
  stats->m_adev = 0.0;
  ON_Interval::Set(&stats->m_range,0.0,0.0);
  bVar5 = true;
  switch(kappa_style) {
  case gaussian_curvature:
    lVar4 = 0;
    break;
  case mean_curvature:
    lVar4 = 1;
    break;
  case min_curvature:
    lVar4 = 2;
    break;
  case max_curvature:
    lVar4 = 3;
    break;
  default:
    lVar4 = 0xffffffff;
    bVar5 = false;
  }
  if (bVar5) {
    iVar1 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    bVar5 = false;
    if ((0 < iVar1) && (bVar5 = false, (this->m_K).m_count == iVar1)) {
      if (this->m_kstat[lVar4] == (ON_MeshCurvatureStats *)0x0) {
        pOVar3 = (ON_MeshCurvatureStats *)operator_new(0x40);
        ON_MeshCurvatureStats::ON_MeshCurvatureStats(pOVar3);
        this->m_kstat[lVar4] = pOVar3;
        ON_MeshCurvatureStats::Set(pOVar3,kappa_style,(this->m_K).m_count,(this->m_K).m_a,in_R8,0.0)
        ;
      }
      pOVar3 = this->m_kstat[lVar4];
      bVar5 = pOVar3 != (ON_MeshCurvatureStats *)0x0;
      if ((bVar5) && (bVar5 = true, pOVar3 != stats)) {
        stats->m_style = pOVar3->m_style;
        stats->m_infinity = pOVar3->m_infinity;
        stats->m_count_infinite = pOVar3->m_count_infinite;
        stats->m_count = pOVar3->m_count;
        stats->m_mode = pOVar3->m_mode;
        stats->m_average = pOVar3->m_average;
        stats->m_adev = pOVar3->m_adev;
        dVar2 = (pOVar3->m_range).m_t[1];
        (stats->m_range).m_t[0] = (pOVar3->m_range).m_t[0];
        (stats->m_range).m_t[1] = dVar2;
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ON_Mesh::GetCurvatureStats( // returns true if successful
       ON::curvature_style kappa_style,
       ON_MeshCurvatureStats& stats
       ) const
{
  bool rc = false;
  stats.Destroy();
  int ksi;
  switch ( kappa_style ) {
    case ON::gaussian_curvature:
      ksi = 0;
      break;
    case ON::mean_curvature:
      ksi = 1;
      break;
    case ON::min_curvature: // minimum unsigned radius of curvature
      ksi = 2;
      break;
    case ON::max_curvature: // maximum unsigned radius of curvature
      ksi = 3;
      break;
    //case ON::section_curvature_x:
    //  ksi = 4;
    //  break;
    //case ON::section_curvature_y:
    //  ksi = 5;
    //  break;
    //case ON::section_curvature_z:
    //  ksi = 6;
    //  break;
    default:
      ksi = -1;
      break;
  }
  if ( ksi >= 0 && ksi <= 3 && HasPrincipalCurvatures() ) {
    ON_Mesh* p = (ON_Mesh*)this; // const lie 
    if ( !m_kstat[ksi] ) {
      p->m_kstat[ksi] = new ON_MeshCurvatureStats();
      p->m_kstat[ksi]->Set( kappa_style, m_K.Count(), m_K.Array(), m_N.Array() );
    }
    if ( p->m_kstat[ksi] ) {
      stats = *p->m_kstat[ksi];
      rc = true;
    }
  }
  return rc;
}